

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_CDict *pZVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ZSTD_customMem in_stack_00000000;
  ZSTD_compressionParameters cParams;
  size_t in_stack_ffffffffffffff80;
  U64 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_CDict *in_stack_ffffffffffffffa8;
  ZSTD_dictContentType_e in_stack_ffffffffffffffb8;
  ZSTD_dictLoadMethod_e in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  ZSTD_strategy in_stack_fffffffffffffff8;
  undefined4 uVar2;
  undefined4 uStack_4;
  
  if (*(int *)(in_RDI + 0x360) == 0) {
    if (*(long *)(in_RDI + 0x1a8) == 0) {
      ZSTD_freeCDict(in_stack_ffffffffffffffa8);
      if ((in_RSI == 0) || (in_RDX == 0)) {
        *(undefined8 *)(in_RDI + 0x368) = 0;
        *(undefined8 *)(in_RDI + 0x370) = 0;
      }
      else {
        ZSTD_getCParamsFromCCtxParams
                  ((ZSTD_CCtx_params *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                   ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        cParams_00.hashLog = (int)in_RSI;
        cParams_00.searchLog = (int)((ulong)in_RSI >> 0x20);
        cParams_00.windowLog = (int)in_RDX;
        cParams_00.chainLog = (int)((ulong)in_RDX >> 0x20);
        cParams_00.searchLength = (int)in_RDI;
        cParams_00.targetLength = (int)((ulong)in_RDI >> 0x20);
        cParams_00.strategy = in_stack_fffffffffffffff8;
        pZVar1 = ZSTD_createCDict_advanced
                           (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,cParams_00,
                            in_stack_00000000);
        *(ZSTD_CDict **)(in_RDI + 0x368) = pZVar1;
        *(undefined8 *)(in_RDI + 0x370) = *(undefined8 *)(in_RDI + 0x368);
        if (*(long *)(in_RDI + 0x368) == 0) {
          uVar2 = 0xffffffc0;
          uStack_4 = 0xffffffff;
          goto LAB_001f2341;
        }
      }
      uVar2 = 0;
      uStack_4 = 0;
    }
    else {
      uVar2 = 0xffffffc0;
      uStack_4 = 0xffffffff;
    }
  }
  else {
    uVar2 = 0xffffffc4;
    uStack_4 = 0xffffffff;
  }
LAB_001f2341:
  return CONCAT44(uStack_4,uVar2);
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
    if (cctx->staticSize) return ERROR(memory_allocation);  /* no malloc for static CCtx */
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_freeCDict(cctx->cdictLocal);  /* in case one already exists */
    if (dict==NULL || dictSize==0) {   /* no dictionary mode */
        cctx->cdictLocal = NULL;
        cctx->cdict = NULL;
    } else {
        ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(&cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, dictSize);
        cctx->cdictLocal = ZSTD_createCDict_advanced(
                                dict, dictSize,
                                dictLoadMethod, dictContentType,
                                cParams, cctx->customMem);
        cctx->cdict = cctx->cdictLocal;
        if (cctx->cdictLocal == NULL)
            return ERROR(memory_allocation);
    }
    return 0;
}